

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O0

string * OpenMD::containerToString<std::vector<int,std::allocator<int>>>
                   (vector<int,_std::allocator<int>_> *cont)

{
  bool bVar1;
  reference piVar2;
  string *in_RDI;
  const_iterator i;
  ostringstream oss;
  string *__lhs;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1a0 [3];
  ostringstream local_188 [392];
  
  __lhs = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"(");
  local_1a0[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     __lhs,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_RDI);
  if (bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(local_1a0);
    std::ostream::operator<<(local_188,*piVar2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_1a0);
  }
  while( true ) {
    std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       __lhs,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)in_RDI);
    if (!bVar1) break;
    std::operator<<((ostream *)local_188,", ");
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(local_1a0);
    std::ostream::operator<<(local_188,*piVar2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_1a0);
  }
  std::operator<<((ostream *)local_188,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __lhs;
}

Assistant:

std::string containerToString(const ContainerType& cont) {
    std::ostringstream oss;
    oss << "(";
    typename ContainerType::const_iterator i = cont.begin();
    if (i != cont.end()) {
      oss << *i;
      ++i;
    }
    for (; i != cont.end(); ++i) {
      oss << ", ";
      oss << *i;
    }
    oss << ")";
    return oss.str();
  }